

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O0

void __thiscall script_p2sh_tests::is::test_method(is *this)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_02;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator __position_01;
  const_iterator __position_02;
  bool bVar1;
  const_string *file;
  CScript *line_num;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> direct;
  CScript not_p2sh;
  CScript p2sh;
  uint160 dummy;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffff678;
  undefined7 in_stack_fffffffffffff680;
  undefined1 in_stack_fffffffffffff687;
  undefined7 in_stack_fffffffffffff688;
  undefined1 in_stack_fffffffffffff68f;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff690;
  undefined7 in_stack_fffffffffffff698;
  undefined1 in_stack_fffffffffffff69f;
  const_string *in_stack_fffffffffffff6a0;
  const_string *msg;
  size_t in_stack_fffffffffffff6a8;
  const_string *in_stack_fffffffffffff6b0;
  undefined7 in_stack_fffffffffffff6b8;
  undefined1 in_stack_fffffffffffff6bf;
  undefined8 in_stack_fffffffffffff6c0;
  undefined7 in_stack_fffffffffffff6c8;
  undefined1 in_stack_fffffffffffff6cf;
  const_string local_6d0 [2];
  lazy_ostream local_6b0 [2];
  assertion_result local_690 [4];
  const_string local_630 [2];
  lazy_ostream local_610 [2];
  assertion_result local_5f0 [4];
  const_string local_590 [2];
  lazy_ostream local_570 [2];
  assertion_result local_550 [5];
  const_string local_4c8 [2];
  lazy_ostream local_4a8 [2];
  assertion_result local_488 [2];
  const_string local_450 [2];
  lazy_ostream local_430 [2];
  assertion_result local_410 [2];
  undefined1 local_3d2;
  undefined1 local_3d1;
  uchar *local_3d0;
  const_string local_3a0 [2];
  lazy_ostream local_380 [2];
  assertion_result local_360 [2];
  undefined1 local_322;
  undefined1 local_321;
  uchar *local_320;
  const_string local_2f0 [2];
  lazy_ostream local_2d0 [2];
  assertion_result local_2b0 [2];
  undefined1 local_272;
  undefined1 local_271;
  uchar *local_270;
  const_string local_240 [2];
  lazy_ostream local_220 [2];
  assertion_result local_200 [2];
  undefined1 local_1c2;
  undefined1 local_1c1;
  uchar *local_1c0;
  const_string local_190 [2];
  lazy_ostream local_170 [2];
  assertion_result local_150 [4];
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uint160::uint160((uint160 *)in_stack_fffffffffffff678);
  CScript::CScript((CScript *)in_stack_fffffffffffff678);
  CScript::operator<<((CScript *)in_stack_fffffffffffff6b0,
                      (opcodetype)(in_stack_fffffffffffff6a8 >> 0x20));
  ToByteVector<uint160>((uint160 *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  b._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff6b8;
  b._M_ptr = (pointer)in_stack_fffffffffffff6b0;
  b._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff6bf;
  CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffff69f,in_stack_fffffffffffff698),b);
  CScript::operator<<((CScript *)in_stack_fffffffffffff6b0,
                      (opcodetype)(in_stack_fffffffffffff6a8 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
               in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    CScript::IsPayToScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (bool)in_stack_fffffffffffff687);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_150,local_170,local_190,0xe0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_e2 = 0xa9;
  local_e1 = 0x14;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff678);
  __l._M_len._0_7_ = in_stack_fffffffffffff6c8;
  __l._M_array = (iterator)in_stack_fffffffffffff6c0;
  __l._M_len._7_1_ = in_stack_fffffffffffff6cf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),__l,
             (allocator_type *)in_stack_fffffffffffff6b0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff678);
  local_1c0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  local_1c1 = 0;
  __position._M_current._7_1_ = in_stack_fffffffffffff6cf;
  __position._M_current._0_7_ = in_stack_fffffffffffff6c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff6a0,
             __position,CONCAT17(in_stack_fffffffffffff69f,in_stack_fffffffffffff698),
             in_stack_fffffffffffff690._M_current);
  local_1c2 = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff678,
             (value_type_conflict3 *)0x9f0694);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
               in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    first._M_current._7_1_ = in_stack_fffffffffffff69f;
    first._M_current._0_7_ = in_stack_fffffffffffff698;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffff678,first,in_stack_fffffffffffff690);
    CScript::IsPayToScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (bool)in_stack_fffffffffffff687);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_200,local_220,local_240,0xe5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    CScript::~CScript((CScript *)in_stack_fffffffffffff678);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_e5 = 0xa9;
  local_e4 = 0x4c;
  local_e3 = 0x14;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff678);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff6c8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff6c0;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff6cf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),__l_00,
             (allocator_type *)in_stack_fffffffffffff6b0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff678);
  local_270 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  local_271 = 0;
  __position_00._M_current._7_1_ = in_stack_fffffffffffff6cf;
  __position_00._M_current._0_7_ = in_stack_fffffffffffff6c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff6a0,
             __position_00,CONCAT17(in_stack_fffffffffffff69f,in_stack_fffffffffffff698),
             in_stack_fffffffffffff690._M_current);
  local_272 = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff678,
             (value_type_conflict3 *)0x9f096c);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
               in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    first_00._M_current._7_1_ = in_stack_fffffffffffff69f;
    first_00._M_current._0_7_ = in_stack_fffffffffffff698;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffff678,first_00,in_stack_fffffffffffff690);
    CScript::IsPayToScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (bool)in_stack_fffffffffffff687);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b0,local_2d0,local_2f0,0xeb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    CScript::~CScript((CScript *)in_stack_fffffffffffff678);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_e9 = 0xa9;
  local_e8 = 0x4d;
  local_e7 = 0x14;
  local_e6 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff678);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff6c8;
  __l_01._M_array = (iterator)in_stack_fffffffffffff6c0;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff6cf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),__l_01,
             (allocator_type *)in_stack_fffffffffffff6b0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff678);
  local_320 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  local_321 = 0;
  __position_01._M_current._7_1_ = in_stack_fffffffffffff6cf;
  __position_01._M_current._0_7_ = in_stack_fffffffffffff6c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff6a0,
             __position_01,CONCAT17(in_stack_fffffffffffff69f,in_stack_fffffffffffff698),
             in_stack_fffffffffffff690._M_current);
  local_322 = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff678,
             (value_type_conflict3 *)0x9f0c4e);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
               in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    first_01._M_current._7_1_ = in_stack_fffffffffffff69f;
    first_01._M_current._0_7_ = in_stack_fffffffffffff698;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffff678,first_01,in_stack_fffffffffffff690);
    CScript::IsPayToScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (bool)in_stack_fffffffffffff687);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_360,local_380,local_3a0,0xef,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    CScript::~CScript((CScript *)in_stack_fffffffffffff678);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_ef = 0xa9;
  local_ee = 0x4e;
  local_ed = 0x14;
  local_ec = 0;
  local_eb = 0;
  local_ea = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff678);
  __l_02._M_len._0_7_ = in_stack_fffffffffffff6c8;
  __l_02._M_array = (iterator)in_stack_fffffffffffff6c0;
  __l_02._M_len._7_1_ = in_stack_fffffffffffff6cf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),__l_02,
             (allocator_type *)in_stack_fffffffffffff6b0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff678);
  local_3d0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  local_3d1 = 0;
  __position_02._M_current._7_1_ = in_stack_fffffffffffff6cf;
  __position_02._M_current._0_7_ = in_stack_fffffffffffff6c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff6a0,
             __position_02,CONCAT17(in_stack_fffffffffffff69f,in_stack_fffffffffffff698),
             in_stack_fffffffffffff690._M_current);
  local_3d2 = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff678,
             (value_type_conflict3 *)0x9f0f40);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
               in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    first_02._M_current._7_1_ = in_stack_fffffffffffff69f;
    first_02._M_current._0_7_ = in_stack_fffffffffffff698;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffff678,first_02,in_stack_fffffffffffff690);
    CScript::IsPayToScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (bool)in_stack_fffffffffffff687);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_410,local_430,local_450,0xf3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    CScript::~CScript((CScript *)in_stack_fffffffffffff678);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::CScript((CScript *)in_stack_fffffffffffff678);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
               in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    CScript::IsPayToScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (bool)in_stack_fffffffffffff687);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_488,local_4a8,local_4c8,0xf6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_fffffffffffff678);
  CScript::operator<<((CScript *)in_stack_fffffffffffff6b0,
                      (opcodetype)(in_stack_fffffffffffff6a8 >> 0x20));
  ToByteVector<uint160>((uint160 *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  b_00._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff6b8;
  b_00._M_ptr = (pointer)in_stack_fffffffffffff6b0;
  b_00._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff6bf;
  CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffff69f,in_stack_fffffffffffff698),b_00)
  ;
  ToByteVector<uint160>((uint160 *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  b_01._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff6b8;
  b_01._M_ptr = (pointer)in_stack_fffffffffffff6b0;
  b_01._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff6bf;
  CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffff69f,in_stack_fffffffffffff698),b_01)
  ;
  CScript::operator<<((CScript *)in_stack_fffffffffffff6b0,
                      (opcodetype)(in_stack_fffffffffffff6a8 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
               in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    CScript::IsPayToScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (bool)in_stack_fffffffffffff687);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_550,local_570,local_590,0xf9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_fffffffffffff678);
  CScript::operator<<((CScript *)in_stack_fffffffffffff6b0,
                      (opcodetype)(in_stack_fffffffffffff6a8 >> 0x20));
  ToByteVector<uint160>((uint160 *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  b_02._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff6b8;
  b_02._M_ptr = (pointer)in_stack_fffffffffffff6b0;
  b_02._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff6bf;
  CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffff69f,in_stack_fffffffffffff698),b_02)
  ;
  CScript::operator<<((CScript *)in_stack_fffffffffffff6b0,
                      (opcodetype)(in_stack_fffffffffffff6a8 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
               in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    CScript::IsPayToScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (bool)in_stack_fffffffffffff687);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5f0,local_610,local_630,0xfc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    in_stack_fffffffffffff6bf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff6bf);
  CScript::clear((CScript *)in_stack_fffffffffffff678);
  file = (const_string *)
         CScript::operator<<((CScript *)in_stack_fffffffffffff6b0,
                             (opcodetype)(in_stack_fffffffffffff6a8 >> 0x20));
  ToByteVector<uint160>((uint160 *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
  b_03._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff6b8;
  b_03._M_ptr = (pointer)file;
  b_03._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff6bf;
  line_num = CScript::operator<<((CScript *)
                                 CONCAT17(in_stack_fffffffffffff69f,in_stack_fffffffffffff698),b_03)
  ;
  CScript::operator<<((CScript *)file,(opcodetype)((ulong)line_num >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),file
               ,(size_t)line_num,msg);
    CScript::IsPayToScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (bool)in_stack_fffffffffffff687);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (basic_cstring<const_char> *)in_stack_fffffffffffff678);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
               (pointer)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
    in_stack_fffffffffffff678 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_690,local_6b0,local_6d0,0xff,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff678);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff678);
    in_stack_fffffffffffff68f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff68f);
  CScript::~CScript((CScript *)in_stack_fffffffffffff678);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688));
  CScript::~CScript((CScript *)in_stack_fffffffffffff678);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(is)
{
    // Test CScript::IsPayToScriptHash()
    uint160 dummy;
    CScript p2sh;
    p2sh << OP_HASH160 << ToByteVector(dummy) << OP_EQUAL;
    BOOST_CHECK(p2sh.IsPayToScriptHash());

    std::vector<unsigned char> direct = {OP_HASH160, 20};
    direct.insert(direct.end(), 20, 0);
    direct.push_back(OP_EQUAL);
    BOOST_CHECK(CScript(direct.begin(), direct.end()).IsPayToScriptHash());

    // Not considered pay-to-script-hash if using one of the OP_PUSHDATA opcodes:
    std::vector<unsigned char> pushdata1 = {OP_HASH160, OP_PUSHDATA1, 20};
    pushdata1.insert(pushdata1.end(), 20, 0);
    pushdata1.push_back(OP_EQUAL);
    BOOST_CHECK(!CScript(pushdata1.begin(), pushdata1.end()).IsPayToScriptHash());
    std::vector<unsigned char> pushdata2 = {OP_HASH160, OP_PUSHDATA2, 20, 0};
    pushdata2.insert(pushdata2.end(), 20, 0);
    pushdata2.push_back(OP_EQUAL);
    BOOST_CHECK(!CScript(pushdata2.begin(), pushdata2.end()).IsPayToScriptHash());
    std::vector<unsigned char> pushdata4 = {OP_HASH160, OP_PUSHDATA4, 20, 0, 0, 0};
    pushdata4.insert(pushdata4.end(), 20, 0);
    pushdata4.push_back(OP_EQUAL);
    BOOST_CHECK(!CScript(pushdata4.begin(), pushdata4.end()).IsPayToScriptHash());

    CScript not_p2sh;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());

    not_p2sh.clear(); not_p2sh << OP_HASH160 << ToByteVector(dummy) << ToByteVector(dummy) << OP_EQUAL;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());

    not_p2sh.clear(); not_p2sh << OP_NOP << ToByteVector(dummy) << OP_EQUAL;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());

    not_p2sh.clear(); not_p2sh << OP_HASH160 << ToByteVector(dummy) << OP_CHECKSIG;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());
}